

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

VkResult shim_vkGetPhysicalDeviceSurfaceSupportKHR
                   (VkPhysicalDevice physicalDevice,uint32_t queueFamilyIndex,VkSurfaceKHR surface,
                   VkBool32 *pSupported)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)&(mock.physical_devices_details.
                     super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0x640;
  lVar2 = 0;
  while( true ) {
    if ((long)mock.physical_device_handles.
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)mock.physical_device_handles.
              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 == lVar2) {
      if (pSupported != (VkBool32 *)0x0 && surface != (VkSurfaceKHR)0x0) {
        *pSupported = 1;
      }
      return VK_SUCCESS;
    }
    if ((mock.physical_device_handles.
         super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
         super__Vector_impl_data._M_start[lVar2] == physicalDevice) &&
       ((ulong)((*plVar1 - plVar1[-1]) / 0x18) <= (ulong)queueFamilyIndex)) break;
    lVar2 = lVar2 + 1;
    plVar1 = plVar1 + 0xd3;
  }
  return VK_ERROR_FORMAT_NOT_SUPPORTED;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkGetPhysicalDeviceSurfaceSupportKHR(
    VkPhysicalDevice physicalDevice, uint32_t queueFamilyIndex, VkSurfaceKHR surface, VkBool32* pSupported) {

    for (size_t i = 0; i < mock.physical_device_handles.size(); i++) {
        if (physicalDevice == mock.physical_device_handles[i]) {
            if (queueFamilyIndex >= mock.physical_devices_details[i].queue_family_properties.size()) {
                return VK_ERROR_FORMAT_NOT_SUPPORTED;
            }
        }
    }
    if (surface && pSupported) {
        *pSupported = true;
    }
    return VK_SUCCESS;
}